

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O3

JavascriptArrayBuffer *
Js::JavascriptArrayBuffer::Create(byte *buffer,uint32 length,DynamicType *type)

{
  Recycler *this;
  code *pcVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  Recycler *alloc;
  JavascriptArrayBuffer *this_00;
  undefined4 *puVar4;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  pSVar3 = Js::Type::GetScriptContext(&type->super_Type);
  this = pSVar3->recycler;
  local_58 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5dae254;
  data.filename._0_4_ = 0x32c;
  alloc = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_58);
  this_00 = (JavascriptArrayBuffer *)new<Memory::Recycler>(0x48,alloc,0x39e810);
  JavascriptArrayBuffer(this_00,buffer,length,type);
  if (this_00 == (JavascriptArrayBuffer *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x32d,"(result)","result");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  Memory::Recycler::AddExternalMemoryUsage(this,(ulong)length);
  return this_00;
}

Assistant:

JavascriptArrayBuffer* JavascriptArrayBuffer::Create(byte* buffer, uint32 length, DynamicType * type)
    {
        Recycler* recycler = type->GetScriptContext()->GetRecycler();
        JavascriptArrayBuffer* result = RecyclerNewFinalized(recycler, JavascriptArrayBuffer, buffer, length, type);
        Assert(result);
        recycler->AddExternalMemoryUsage(length);
        return result;
    }